

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O1

int Sfm_LibImplementSimple
              (Sfm_Lib_t *p,word *pTruth,int *pFanins,int nFanins,Vec_Int_t *vGates,
              Vec_Wec_t *vFanins)

{
  int iVar1;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar2;
  Vec_Int_t *p_00;
  long lVar3;
  long lVar4;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  iVar1 = p->nWords;
  lVar3 = (long)iVar1;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      if (pTruth[lVar4] != 0) {
        if (0 < iVar1) {
          lVar4 = 0;
          goto LAB_00528da7;
        }
        break;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  goto LAB_00528db6;
  while (lVar4 = lVar4 + 8, lVar3 * 8 - lVar4 != 0) {
LAB_00528e28:
    if (*(long *)((long)pTruth + lVar4) != *(long *)((long)s_Truth8[0] + lVar4)) {
      if (0 < iVar1) {
        lVar4 = 0;
        do {
          if ((*(ulong *)((long)s_Truth8[0] + lVar4) ^ *(ulong *)((long)pTruth + lVar4)) !=
              0xffffffffffffffff) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                          ,0x2bd,
                          "int Sfm_LibImplementSimple(Sfm_Lib_t *, word *, int *, int, Vec_Int_t *, Vec_Wec_t *)"
                         );
          }
          lVar4 = lVar4 + 8;
        } while (lVar3 * 8 - lVar4 != 0);
      }
      break;
    }
  }
LAB_00528e5e:
  if (nFanins != 1) {
    __assert_fail("nFanins == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x2b6,
                  "int Sfm_LibImplementSimple(Sfm_Lib_t *, word *, int *, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      if (*(long *)((long)pTruth + lVar4) != *(long *)((long)s_Truth8[0] + lVar4)) {
        pMVar2 = Mio_LibraryReadInv(pLib);
        goto LAB_00528e96;
      }
      lVar4 = lVar4 + 8;
    } while (lVar3 * 8 != lVar4);
  }
  pMVar2 = Mio_LibraryReadBuf(pLib);
LAB_00528e96:
  iVar1 = Mio_GateReadValue(pMVar2);
  Vec_IntPush(vGates,iVar1);
  p_00 = Vec_WecPushLevel(vFanins);
  Vec_IntPush(p_00,*pFanins);
  return 1;
  while (lVar4 = lVar4 + 1, lVar3 != lVar4) {
LAB_00528da7:
    if (pTruth[lVar4] != 0xffffffffffffffff) {
      if (iVar1 < 1) goto LAB_00528e5e;
      lVar4 = 0;
      goto LAB_00528e28;
    }
  }
LAB_00528db6:
  if (nFanins != 0) {
    __assert_fail("nFanins == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x2ae,
                  "int Sfm_LibImplementSimple(Sfm_Lib_t *, word *, int *, int, Vec_Int_t *, Vec_Wec_t *)"
                 );
  }
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      if (pTruth[lVar4] != 0xffffffffffffffff) {
        pMVar2 = Mio_LibraryReadConst0(pLib);
        goto LAB_00528de5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  pMVar2 = Mio_LibraryReadConst1(pLib);
LAB_00528de5:
  iVar1 = Mio_GateReadValue(pMVar2);
  Vec_IntPush(vGates,iVar1);
  Vec_WecPushLevel(vFanins);
  return 1;
}

Assistant:

int Sfm_LibImplementSimple( Sfm_Lib_t * p, word * pTruth, int * pFanins, int nFanins, Vec_Int_t * vGates, Vec_Wec_t * vFanins )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    Mio_Gate_t * pGate;
    Vec_Int_t * vLevel;
    if ( Abc_TtIsConst0(pTruth, p->nWords) || Abc_TtIsConst1(pTruth, p->nWords) )
    {
        assert( nFanins == 0 );
        pGate = Abc_TtIsConst1(pTruth, p->nWords) ? Mio_LibraryReadConst1(pLib) : Mio_LibraryReadConst0(pLib);
        Vec_IntPush( vGates, Mio_GateReadValue(pGate) );
        vLevel = Vec_WecPushLevel( vFanins );
        return 1;
    }
    if ( Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) || Abc_TtOpposite(pTruth, s_Truth8[0], p->nWords) )
    {
        assert( nFanins == 1 );
        pGate = Abc_TtEqual(pTruth, s_Truth8[0], p->nWords) ? Mio_LibraryReadBuf(pLib) : Mio_LibraryReadInv(pLib);
        Vec_IntPush( vGates, Mio_GateReadValue(pGate) );
        vLevel = Vec_WecPushLevel( vFanins );
        Vec_IntPush( vLevel, pFanins[0] );
        return 1;
    }
    assert( 0 );
    return -1;
}